

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connecion.cpp
# Opt level: O1

void __thiscall Markov::Connection::TrainFull(Connection *this,string_view src,TrainData *td)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  string_view src_00;
  sviterator iter;
  regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> local_140;
  regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> local_b8;
  
  if ((td->sep).
      super__Optional_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>
      ._M_engaged != true) {
    TrainPart(this,src,td);
    return;
  }
  std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
  regex_token_iterator(&local_140,src._M_str,src._M_str + src._M_len,(regex_type *)&td->sep,-1,0);
  while (bVar2 = std::__cxx11::
                 regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
                 operator==(&local_140,&td->badIter), !bVar2) {
    pcVar3 = ((local_140._M_result)->super_pair<const_char_*,_const_char_*>).first;
    pcVar1 = ((local_140._M_result)->super_pair<const_char_*,_const_char_*>).second + -(long)pcVar3;
    if (((local_140._M_result)->matched & 1U) == 0) {
      pcVar3 = (char *)0x0;
      pcVar1 = (char *)0x0;
    }
    src_00._M_str = pcVar3;
    src_00._M_len = (size_t)pcVar1;
    TrainPart(this,src_00,td);
    std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    operator++(&local_b8,&local_140,0);
    if (local_b8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b8._M_position._M_match.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8._M_position._M_match.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8._M_position._M_match.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8._M_position._M_match.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_140._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_140._M_position._M_match.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140._M_position._M_match.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_140._M_position._M_match.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140._M_position._M_match.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Connection::TrainFull(std::string_view src, const TrainData& td) {
		if (td.sep) {
				for (auto iter = sviterator(src.begin(), src.end(), *td.sep, -1); iter != td.badIter; iter++) {
						TrainPart(matchToSv(*iter), td);
						}
				}
		else {
				TrainPart(src, td);
				}
		}